

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O2

int write_sparse_end_chunk(output_file *out)

{
  int iVar1;
  chunk_header_t chunk_header;
  
  iVar1 = 0;
  if (out->use_crc != 0) {
    chunk_header.chunk_type = 0xcac4;
    chunk_header.reserved1 = 0;
    chunk_header.chunk_sz = 0;
    chunk_header.total_sz = 0x10;
    iVar1 = (*out->ops->write)(out,&chunk_header,0xc);
    if (-1 < iVar1) {
      (*out->ops->write)(out,&out->crc32,4);
      out->chunk_cnt = out->chunk_cnt + 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int write_sparse_end_chunk(struct output_file* out) {
  chunk_header_t chunk_header;
  int ret;

  if (out->use_crc) {
    chunk_header.chunk_type = CHUNK_TYPE_CRC32;
    chunk_header.reserved1 = 0;
    chunk_header.chunk_sz = 0;
    chunk_header.total_sz = CHUNK_HEADER_LEN + 4;

    ret = out->ops->write(out, &chunk_header, sizeof(chunk_header));
    if (ret < 0) {
      return ret;
    }
    out->ops->write(out, &out->crc32, 4);
    if (ret < 0) {
      return ret;
    }

    out->chunk_cnt++;
  }

  return 0;
}